

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O2

bool __thiscall MT32Emu::Poly::startAbort(Poly *this)

{
  bool bVar1;
  Synth *pSVar2;
  long lVar3;
  
  if (this->state == POLY_Inactive) {
    return false;
  }
  pSVar2 = Part::getSynth(this->part);
  if (pSVar2->abortingPoly == (Poly *)0x0) {
    for (lVar3 = 4; lVar3 != 8; lVar3 = lVar3 + 1) {
      if (this->partials[lVar3 + -4] != (Partial *)0x0) {
        Partial::startAbort(this->partials[lVar3 + -4]);
        pSVar2 = Part::getSynth(this->part);
        pSVar2->abortingPoly = this;
      }
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Poly::startAbort() {
	if (state == POLY_Inactive || part->getSynth()->isAbortingPoly()) {
		return false;
	}
	for (int t = 0; t < 4; t++) {
		Partial *partial = partials[t];
		if (partial != NULL) {
			partial->startAbort();
			part->getSynth()->abortingPoly = this;
		}
	}
	return true;
}